

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_mail(connectdata *conn)

{
  SessionHandle *pSVar1;
  SessionHandle *data;
  char *pcStack_30;
  CURLcode result;
  char *size;
  char *auth;
  char *from;
  connectdata *conn_local;
  
  size = (char *)0x0;
  pcStack_30 = (char *)0x0;
  pSVar1 = conn->data;
  if ((pSVar1->set).str[0x25] == (char *)0x0) {
    auth = (*Curl_cstrdup)("<>");
  }
  else if (*(pSVar1->set).str[0x25] == '<') {
    auth = curl_maprintf("%s",(pSVar1->set).str[0x25]);
  }
  else {
    auth = curl_maprintf("<%s>",(pSVar1->set).str[0x25]);
  }
  if (auth == (char *)0x0) {
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    if (((pSVar1->set).str[0x26] != (char *)0x0) && ((conn->proto).imapc.cmdid != 0)) {
      if (*(pSVar1->set).str[0x26] == '\0') {
        size = (*Curl_cstrdup)("<>");
      }
      else {
        size = curl_maprintf("%s",(pSVar1->set).str[0x26]);
      }
      if (size == (char *)0x0) {
        if (auth != (char *)0x0) {
          (*Curl_cfree)(auth);
        }
        return CURLE_OUT_OF_MEMORY;
      }
    }
    if (((((conn->proto).imapc.resptag[1] & 1U) == 0) || ((conn->data->state).infilesize < 1)) ||
       (pcStack_30 = curl_maprintf("%ld",(pSVar1->state).infilesize), pcStack_30 != (char *)0x0)) {
      if ((size == (char *)0x0) && (pcStack_30 == (char *)0x0)) {
        data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"MAIL FROM:%s",auth);
      }
      else if ((size == (char *)0x0) || (pcStack_30 != (char *)0x0)) {
        if ((size == (char *)0x0) || (pcStack_30 == (char *)0x0)) {
          data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"MAIL FROM:%s SIZE=%s",auth,pcStack_30);
        }
        else {
          data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"MAIL FROM:%s AUTH=%s SIZE=%s",auth,size
                                     ,pcStack_30);
        }
      }
      else {
        data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"MAIL FROM:%s AUTH=%s",auth,size);
      }
      if (auth != (char *)0x0) {
        (*Curl_cfree)(auth);
      }
      if (size != (char *)0x0) {
        (*Curl_cfree)(size);
      }
      if (pcStack_30 != (char *)0x0) {
        (*Curl_cfree)(pcStack_30);
      }
      if (data._4_4_ == CURLE_OK) {
        state(conn,SMTP_MAIL);
      }
      conn_local._4_4_ = data._4_4_;
    }
    else {
      if (auth != (char *)0x0) {
        (*Curl_cfree)(auth);
      }
      if (size != (char *)0x0) {
        (*Curl_cfree)(size);
      }
      conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smtp_perform_mail(struct connectdata *conn)
{
  char *from = NULL;
  char *auth = NULL;
  char *size = NULL;
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;

  /* Calculate the FROM parameter */
  if(!data->set.str[STRING_MAIL_FROM])
    /* Null reverse-path, RFC-5321, sect. 3.6.3 */
    from = strdup("<>");
  else if(data->set.str[STRING_MAIL_FROM][0] == '<')
    from = aprintf("%s", data->set.str[STRING_MAIL_FROM]);
  else
    from = aprintf("<%s>", data->set.str[STRING_MAIL_FROM]);

  if(!from)
    return CURLE_OUT_OF_MEMORY;

  /* Calculate the optional AUTH parameter */
  if(data->set.str[STRING_MAIL_AUTH] && conn->proto.smtpc.authused) {
    if(data->set.str[STRING_MAIL_AUTH][0] != '\0')
      auth = aprintf("%s", data->set.str[STRING_MAIL_AUTH]);
    else
      /* Empty AUTH, RFC-2554, sect. 5 */
      auth = strdup("<>");

    if(!auth) {
      Curl_safefree(from);

      return CURLE_OUT_OF_MEMORY;
    }
  }

  /* Calculate the optional SIZE parameter */
  if(conn->proto.smtpc.size_supported && conn->data->state.infilesize > 0) {
    size = aprintf("%" CURL_FORMAT_CURL_OFF_T, data->state.infilesize);

    if(!size) {
      Curl_safefree(from);
      Curl_safefree(auth);

      return CURLE_OUT_OF_MEMORY;
    }
  }

  /* Send the MAIL command */
  if(!auth && !size)
    result = Curl_pp_sendf(&conn->proto.smtpc.pp,
                           "MAIL FROM:%s", from);
  else if(auth && !size)
    result = Curl_pp_sendf(&conn->proto.smtpc.pp,
                           "MAIL FROM:%s AUTH=%s", from, auth);
  else if(auth && size)
    result = Curl_pp_sendf(&conn->proto.smtpc.pp,
                           "MAIL FROM:%s AUTH=%s SIZE=%s", from, auth, size);
  else
    result = Curl_pp_sendf(&conn->proto.smtpc.pp,
                           "MAIL FROM:%s SIZE=%s", from, size);

  Curl_safefree(from);
  Curl_safefree(auth);
  Curl_safefree(size);

  if(!result)
    state(conn, SMTP_MAIL);

  return result;
}